

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawFogBoundaryLinePalCommand::Execute
          (DrawFogBoundaryLinePalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = DrawerThread::line_skipped_by_thread
                    (thread,*(int *)&(this->super_PalSpanCommand).field_0x64);
  if (!bVar4) {
    puVar2 = this->_colormap;
    iVar1 = (&ylookup)[*(int *)&(this->super_PalSpanCommand).field_0x64];
    puVar3 = this->_destorg;
    lVar5 = (long)this->x1 + -1;
    do {
      puVar3[lVar5 + (long)iVar1 + 1] = puVar2[puVar3[lVar5 + (long)iVar1 + 1]];
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->x2);
  }
  return;
}

Assistant:

void DrawFogBoundaryLinePalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t *colormap = _colormap;
		uint8_t *dest = ylookup[y] + _destorg;
		int x = x1;
		do
		{
			dest[x] = colormap[dest[x]];
		} while (++x <= x2);
	}